

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

void __thiscall uS::Socket::changePoll(Socket *this,SocketData *socketData)

{
  pthread_t pVar1;
  pthread_t pVar2;
  uv_poll_cb p_Var3;
  long *in_RSI;
  vector<uv_poll_s_*,_std::allocator<uv_poll_s_*>_> *in_RDI;
  mutex *in_stack_ffffffffffffffd0;
  uv_poll_t *puVar4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 uVar5;
  
  pVar1 = *(pthread_t *)(*in_RSI + 0x40);
  pVar2 = pthread_self();
  if (pVar1 == pVar2) {
    puVar4 = (uv_poll_t *)
             (in_RDI->super__Vector_base<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (undefined4)in_RSI[3];
    p_Var3 = getPollCallback((Socket *)in_RDI);
    uv_poll_start(puVar4,uVar5,p_Var3);
  }
  else {
    std::mutex::lock(in_stack_ffffffffffffffd0);
    std::vector<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>::push_back
              (in_RDI,(value_type *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::mutex::unlock((mutex *)0x136773);
    uv_async_send(*(undefined8 *)(*in_RSI + 0x38));
  }
  return;
}

Assistant:

void changePoll(SocketData *socketData) {
        if (socketData->nodeData->tid != pthread_self()) {
            socketData->nodeData->asyncMutex->lock();
            socketData->nodeData->changePollQueue.push_back(p);
            socketData->nodeData->asyncMutex->unlock();
            uv_async_send(socketData->nodeData->async);
        } else {
            uv_poll_start(p, socketData->poll, getPollCallback());
        }
    }